

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O1

char * decodeText(char *src)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  char cVar4;
  char *pcVar5;
  size_t __size;
  
  __size = 1;
  pcVar3 = src;
  do {
    if (*pcVar3 == '\\') {
      if ((int)pcVar3[1] - 0x30U < 10) {
        pcVar3 = pcVar3 + 3;
      }
      else {
        pcVar3 = pcVar3 + 1;
      }
    }
    else if (*pcVar3 == '\0') break;
    pcVar3 = pcVar3 + 1;
    __size = __size + 1;
  } while( true );
  pcVar2 = (char *)malloc(__size);
  pcVar3 = pcVar2;
  do {
    cVar4 = *src;
    if (cVar4 == '\\') {
      pcVar5 = src + 1;
      cVar1 = src[1];
      if (cVar1 == '\\') goto LAB_001c535e;
      if (cVar1 == 'r') {
        cVar4 = '\r';
        goto LAB_001c535e;
      }
      if (cVar1 == 'n') {
        cVar4 = '\n';
        goto LAB_001c535e;
      }
      if ((int)cVar1 - 0x30U < 10) {
        pcVar5 = src + 3;
        cVar4 = src[2] * '\b' + cVar1 * '@' + src[3] + 'P';
        goto LAB_001c535e;
      }
    }
    else {
      pcVar5 = src;
      if (cVar4 == '\0') {
        *pcVar3 = '\0';
        return pcVar2;
      }
LAB_001c535e:
      *pcVar3 = cVar4;
      pcVar3 = pcVar3 + 1;
    }
    src = pcVar5 + 1;
  } while( true );
}

Assistant:

static char *decodeText( const char *src ) {
  int len = 0;
  const char *s = src;
  for ( ; *s; s++, len++ ) {
    if ( *s == '\\' ) {
      if ( isdigit( s[1] ) ) {
        s+=3; 
      } else { 
        s+=1;
      }
    }
  }
  char *dst = (char*)malloc( len+1 ), *d = dst;
  for ( s = src; *s; s++ ) {
    char c = *s;
    if ( c == '\\' ) {
      if ( s[1] == '\\' ) { *d++ = c; s++; }
      else if ( s[1] == 'n' ) { *d++ = '\n'; s++; }
      else if ( s[1] == 'r' ) { *d++ = '\r'; s++; }
      else if ( isdigit( s[1] ) ) { *d++ = ((s[1]-'0')<<6) + ((s[2]-'0')<<3) + (s[3]-'0'); s+=3; }
      else s++; // error
    }
    else
      *d++ = c;
  }
  *d = 0;
  return dst;
}